

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printBlock(PrinterStream *this,Block *b)

{
  bool bVar1;
  CodePrinter *pCVar2;
  Iterator other;
  Statement *s_00;
  Object *s_01;
  Indent IVar3;
  Statement *s;
  Iterator __end2;
  Iterator __begin2;
  LinkedList<soul::heart::Statement> *__range2;
  Indent statementIndent;
  string local_48;
  undefined1 local_28 [8];
  Indent labelIndent;
  Block *b_local;
  PrinterStream *this_local;
  
  labelIndent._8_8_ = b;
  IVar3 = choc::text::CodePrinter::createIndent((CodePrinter *)local_28,(size_t)this->out);
  pCVar2 = this->out;
  getBlockName_abi_cxx11_(&local_48,(PrinterStream *)labelIndent._8_8_,IVar3._8_8_);
  choc::text::CodePrinter::operator<<(pCVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = std::
          vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
          ::empty((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                   *)(labelIndent._8_8_ + 0x20));
  if (!bVar1) {
    ArrayView<soul::pool_ref<soul::heart::Variable>>::
    ArrayView<std::vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>>
              ((ArrayView<soul::pool_ref<soul::heart::Variable>> *)&statementIndent.amount,
               (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                *)(labelIndent._8_8_ + 0x20));
    printParameters(this,stack0xffffffffffffff98);
  }
  pCVar2 = choc::text::CodePrinter::operator<<(this->out,":");
  choc::text::CodePrinter::operator<<(pCVar2,(NewLine *)&newLine);
  choc::text::CodePrinter::createIndent((CodePrinter *)&__range2,(size_t)this->out);
  __end2 = LinkedList<soul::heart::Statement>::begin
                     ((LinkedList<soul::heart::Statement> *)(labelIndent._8_8_ + 0x38));
  other = LinkedList<soul::heart::Statement>::end();
  while( true ) {
    bVar1 = LinkedList<soul::heart::Statement>::Iterator::operator!=(&__end2,other);
    if (!bVar1) break;
    s_00 = LinkedList<soul::heart::Statement>::Iterator::operator*(&__end2);
    printStatementDescription(this,&s_00->super_Object);
    pCVar2 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::operator<<(pCVar2,(NewLine *)&newLine);
    LinkedList<soul::heart::Statement>::Iterator::operator++(&__end2);
  }
  s_01 = &pool_ptr<soul::heart::Terminator>::operator*
                    ((pool_ptr<soul::heart::Terminator> *)(labelIndent._8_8_ + 0x40))->super_Object;
  printStatementDescription(this,s_01);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out,';');
  choc::text::CodePrinter::operator<<(pCVar2,(NewLine *)&newLine);
  choc::text::CodePrinter::Indent::~Indent((Indent *)&__range2);
  choc::text::CodePrinter::Indent::~Indent((Indent *)local_28);
  return;
}

Assistant:

void printBlock (heart::Block& b)
        {
            auto labelIndent = out.createIndent (2);
            out << getBlockName (b);

            if (!b.parameters.empty())
                printParameters (b.parameters);

            out << ":" << newLine;

            auto statementIndent = out.createIndent (2);

            for (auto s : b.statements)
            {
                printStatementDescription (*s);
                out << ';' << newLine;
            }

            printStatementDescription (*b.terminator);
            out << ';' << newLine;
        }